

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

int cmsys::anon_unknown_3::GetFieldsFromFile<long_long>
              (char *fileName,char **fieldNames,longlong *values)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  char *pcVar5;
  istringstream *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  char **ppcVar12;
  bool bVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  char buf [1024];
  allocator<char> local_4a1;
  char **local_4a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  long *local_480 [2];
  long local_470 [2];
  longlong *local_460;
  long *local_458 [2];
  long local_448 [2];
  istringstream local_438 [120];
  ios_base local_3c0 [912];
  
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a0 = fieldNames;
  local_460 = values;
  __stream = fopen(fileName,"r");
  iVar2 = -1;
  if (__stream != (FILE *)0x0) {
    iVar3 = 0;
    memset(local_438,0,0x400);
    iVar2 = feof(__stream);
    bVar13 = true;
    if (iVar2 == 0) {
LAB_005216e9:
      iVar2 = ferror(__stream);
      if (iVar2 == 0) {
        piVar4 = __errno_location();
        *piVar4 = 0;
        pcVar5 = fgets((char *)local_438,0x400,__stream);
        piVar6 = local_438;
        if (pcVar5 != (char *)0x0) {
          do {
            if (*piVar6 == (istringstream)0xa) {
              *piVar6 = (istringstream)0x0;
            }
            else if (*piVar6 == (istringstream)0x0) goto LAB_0052175c;
            piVar6 = piVar6 + 1;
          } while( true );
        }
        iVar2 = ferror(__stream);
        if ((iVar2 != 0) && (*piVar4 == 4)) {
          clearerr(__stream);
        }
        iVar2 = feof(__stream);
        if (iVar2 == 0) goto LAB_005216e9;
      }
      bVar13 = iVar3 == 0;
    }
LAB_00521782:
    iVar3 = ferror(__stream);
    fclose(__stream);
    iVar2 = -1;
    if (!(bool)(iVar3 != 0 | bVar13)) {
      lVar8 = 0;
      ppcVar12 = local_4a0;
      do {
        lVar7 = lVar8;
        if (ppcVar12[lVar7] == (char *)0x0) {
          iVar2 = 0;
          goto LAB_00521927;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_480,ppcVar12[lVar7],&local_4a1);
        if ((long)local_498.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_498.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0) {
          bVar13 = true;
        }
        else {
          uVar11 = (long)local_498.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_498.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar10 = 0;
          lVar8 = std::__cxx11::string::find
                            ((char *)local_498.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(ulong)local_480[0],0
                            );
          if (lVar8 == -1) {
            lVar8 = 0x20;
            uVar1 = 1;
            do {
              uVar10 = uVar1;
              if (uVar11 + (uVar11 == 0) == uVar10) {
                bVar13 = uVar11 <= uVar10;
                ppcVar12 = local_4a0;
                goto LAB_005218e2;
              }
              lVar9 = std::__cxx11::string::find
                                ((char *)((long)&((local_498.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar8),(ulong)local_480[0],0);
              lVar8 = lVar8 + 0x20;
              uVar1 = uVar10 + 1;
            } while (lVar9 == -1);
            bVar13 = uVar11 <= uVar10;
            ppcVar12 = local_4a0;
          }
          else {
            bVar13 = false;
          }
          std::__cxx11::string::substr
                    ((ulong)local_458,
                     (ulong)(local_498.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar10));
          std::__cxx11::istringstream::istringstream(local_438,(string *)local_458,_S_in);
          if (local_458[0] != local_448) {
            operator_delete(local_458[0],local_448[0] + 1);
          }
          std::istream::_M_extract<long_long>((longlong *)local_438);
          std::__cxx11::istringstream::~istringstream(local_438);
          std::ios_base::~ios_base(local_3c0);
        }
LAB_005218e2:
        if (local_480[0] != local_470) {
          operator_delete(local_480[0],local_470[0] + 1);
        }
        lVar8 = lVar7 + 1;
      } while (!bVar13);
      iVar2 = -2 - (int)lVar7;
    }
  }
LAB_00521927:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_498);
  return iVar2;
LAB_0052175c:
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char(&)[1024]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_498,
             (char (*) [1024])local_438);
  iVar3 = iVar3 + 1;
  iVar2 = feof(__stream);
  bVar13 = false;
  if (iVar2 != 0) goto LAB_00521782;
  goto LAB_005216e9;
}

Assistant:

int GetFieldsFromFile(const char* fileName, const char** fieldNames, T* values)
{
  std::vector<std::string> fields;
  if (!LoadLines(fileName, fields)) {
    return -1;
  }
  int i = 0;
  while (fieldNames[i] != nullptr) {
    int ierr = NameValue(fields, fieldNames[i], values[i]);
    if (ierr) {
      return -(i + 2);
    }
    i += 1;
  }
  return 0;
}